

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void helper_set_macsr_m68k(CPUM68KState_conflict *env,uint32_t val)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = env->macsr;
  if (((uVar1 ^ val) & 0x60) != 0) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      uVar3 = env->macc[lVar2];
      if (((uVar1 & 0x20) == 0) && ((uVar1 & 0x40) == 0)) {
        uVar3 = uVar3 & 0xffffffffffff;
      }
      else {
        uVar3 = (long)(char)(uVar3 >> 0x28) << 0x28 | uVar3 & 0xffffffffff;
      }
      env->macc[lVar2] = uVar3;
    }
  }
  env->macsr = val;
  return;
}

Assistant:

void HELPER(set_macsr)(CPUM68KState *env, uint32_t val)
{
    uint32_t acc;
    int8_t exthigh;
    uint8_t extlow;
    uint64_t regval;
    int i;
    if ((env->macsr ^ val) & (MACSR_FI | MACSR_SU)) {
        for (i = 0; i < 4; i++) {
            regval = env->macc[i];
            exthigh = regval >> 40;
            if (env->macsr & MACSR_FI) {
                acc = regval >> 8;
                extlow = regval;
            } else {
                acc = regval;
                extlow = regval >> 32;
            }
            if (env->macsr & MACSR_FI) {
                regval = (((uint64_t)acc) << 8) | extlow;
                regval |= ((int64_t)exthigh) << 40;
            } else if (env->macsr & MACSR_SU) {
                regval = acc | (((int64_t)extlow) << 32);
                regval |= ((int64_t)exthigh) << 40;
            } else {
                regval = acc | (((uint64_t)extlow) << 32);
                regval |= ((uint64_t)(uint8_t)exthigh) << 40;
            }
            env->macc[i] = regval;
        }
    }
    env->macsr = val;
}